

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

ChMatrix33<double> * __thiscall
chrono::fea::ChElementBeamANCF_3333::GetGreenLagrangeStrain
          (ChMatrix33<double> *__return_storage_ptr__,ChElementBeamANCF_3333 *this,double xi,
          double eta,double zeta)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  double *pdVar17;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ChMatrixNMc<double,_3,_3> F;
  ChMatrix33<double> I3x3;
  Matrix3xN e_bar;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  double adStack_338 [3];
  ulong auStack_320 [3];
  undefined1 local_308 [32];
  ulong auStack_2e8 [6];
  MatrixNx3c *local_2b8;
  Matrix<double,_3,_3,_1,_3,_3> *local_2b0;
  undefined8 local_2a8;
  MatrixNx3c *local_2a0;
  SrcXprType local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 local_260;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
  local_258 [16];
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  MatrixNx3c **local_230;
  Matrix3xN local_218;
  Matrix<double,_3,_3,_1,_3,_3> local_140;
  MatrixNx3c local_f8;
  
  auStack_320[2] = 0x73424b;
  Calc_Sxi_D(this,&local_f8,xi,eta,zeta);
  auStack_320[2] = 0x734265;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_140,&this->m_ebar0,&local_f8);
  auStack_320[2] = 0x73428b;
  local_308._0_8_ = &local_f8;
  local_2a0 = &local_f8;
  local_298.m_xpr = &local_140;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_308 + 8),&local_298,
        (assign_op<double,_double> *)&local_218);
  local_2b8 = (MatrixNx3c *)local_308._0_8_;
  local_2a8 = 3;
  auVar3 = *(undefined1 (*) [16])
            (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage)
            .m_data.array;
  auVar4 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage
             ).m_data.array + 2);
  auVar5 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage
             ).m_data.array + 4);
  auVar6 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage
             ).m_data.array + 6);
  auVar7 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage
             ).m_data.array + 9);
  auVar8 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage
             ).m_data.array + 0x12);
  auVar9 = *(undefined1 (*) [16])
            ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage
             ).m_data.array + 0xb);
  auVar10 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->
              m_storage).m_data.array + 0x14);
  auVar11 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->
              m_storage).m_data.array + 0xd);
  auVar12 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->
              m_storage).m_data.array + 0x16);
  auVar13 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->
              m_storage).m_data.array + 0xf);
  auVar14 = *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->
              m_storage).m_data.array + 0x18);
  dVar1 = (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage).
          m_data.array[8];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage).
       m_data.array[0x11];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (((PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_> *)local_308._0_8_)->m_storage).
       m_data.array[0x1a];
  lVar16 = 7;
  pdVar17 = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
            array + 8;
  do {
    dVar2 = adStack_338[lVar16];
    auVar23._8_8_ = dVar2;
    auVar23._0_8_ = dVar2;
    auVar18 = vmulpd_avx512vl(auVar3,auVar23);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auStack_320[lVar16];
    auVar19 = vmovddup_avx512vl(auVar19);
    auVar20 = vfmadd231pd_avx512vl(auVar18,auVar7,auVar19);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auStack_2e8[lVar16 + -4];
    auVar18 = vmovddup_avx512vl(auVar18);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar8,auVar18);
    *(undefined1 (*) [16])((plain_array<double,_27,_1,_0> *)(pdVar17 + -8))->array = auVar20;
    auVar20 = vmulpd_avx512vl(auVar4,auVar23);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar9,auVar19);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar10,auVar18);
    *(undefined1 (*) [16])(pdVar17 + -6) = auVar20;
    auVar20 = vmulpd_avx512vl(auVar5,auVar23);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar11,auVar19);
    auVar20 = vfmadd231pd_avx512vl(auVar20,auVar12,auVar18);
    *(undefined1 (*) [16])(pdVar17 + -4) = auVar20;
    auVar20 = vmulpd_avx512vl(auVar6,auVar23);
    auVar19 = vfmadd231pd_avx512vl(auVar20,auVar13,auVar19);
    auVar19 = vfmadd231pd_avx512vl(auVar19,auVar14,auVar18);
    *(undefined1 (*) [16])(pdVar17 + -2) = auVar19;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = auStack_320[lVar16];
    auVar19 = vmulsd_avx512f(auVar21,auVar20);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auStack_2e8[lVar16 + -4];
    auVar18 = vmulsd_avx512f(auVar22,auVar15);
    auVar19 = vaddsd_avx512f(auVar19,auVar18);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar1 * dVar2;
    auVar19 = vaddsd_avx512f(auVar24,auVar19);
    *pdVar17 = auVar19._0_8_;
    lVar16 = lVar16 + 1;
    pdVar17 = pdVar17 + 9;
  } while (lVar16 != 10);
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [0];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[1] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [1];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[2] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [2];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[3] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [3];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[4] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [4];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[5] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [5];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[6] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [6];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[7] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [7];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[8] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [8];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[9] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [9];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[10] =
       local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array
       [10];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xb]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0xb];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xc]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0xc];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xd]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0xd];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xe]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0xe];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0xf]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0xf];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x10]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x10];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x11]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x11];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x12]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x12];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x13]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x13];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x14]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x14];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x15]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x15];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x16]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x16];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x17]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x17];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x18]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x18];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x19]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x19];
  local_f8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_0,_9,_3>_>.m_storage.m_data.array[0x1a]
       = local_218.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.
         array[0x1a];
  auStack_320[2] = 0x734429;
  local_2b0 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_308 + 8);
  CalcCoordMatrix(this,&local_218);
  auStack_320[2] = 0x73443a;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)local_308,&local_218,&local_f8);
  local_230 = &local_2a0;
  local_2a0 = (MatrixNx3c *)0x3ff0000000000000;
  local_298.m_xpr = (XprTypeNested)0x0;
  uStack_290 = 0;
  local_288 = 0;
  local_280 = 0x3ff0000000000000;
  local_278 = 0;
  uStack_270 = 0;
  local_268 = 0;
  local_260 = 0x3ff0000000000000;
  local_248 = 0x3fe0000000000000;
  auStack_320[2] = 0x734496;
  local_240 = local_308;
  local_238 = local_308;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>const>>
            (__return_storage_ptr__,local_258);
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementBeamANCF_3333::GetGreenLagrangeStrain(const double xi,
                                                    const double eta,
                                                    const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    ChMatrix33<> I3x3;
    I3x3.setIdentity();
    return 0.5 * (F.transpose() * F - I3x3);
}